

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

JavascriptError * __thiscall
Js::JavascriptError::CreateNewErrorOfSameType
          (JavascriptError *this,JavascriptLibrary *targetJavascriptLibrary)

{
  code *pcVar1;
  bool bVar2;
  ErrorTypeEnum EVar3;
  undefined4 *puVar4;
  JavascriptError *local_20;
  JavascriptError *jsNewError;
  JavascriptLibrary *targetJavascriptLibrary_local;
  JavascriptError *this_local;
  
  local_20 = (JavascriptError *)0x0;
  EVar3 = GetErrorType(this);
  switch(EVar3) {
  case kjstError:
    local_20 = JavascriptLibrary::CreateError(targetJavascriptLibrary);
    break;
  case kjstEvalError:
    local_20 = JavascriptLibrary::CreateEvalError(targetJavascriptLibrary);
    break;
  case kjstRangeError:
    local_20 = JavascriptLibrary::CreateRangeError(targetJavascriptLibrary);
    break;
  case kjstReferenceError:
    local_20 = JavascriptLibrary::CreateReferenceError(targetJavascriptLibrary);
    break;
  case kjstSyntaxError:
    local_20 = JavascriptLibrary::CreateSyntaxError(targetJavascriptLibrary);
    break;
  case kjstTypeError:
    local_20 = JavascriptLibrary::CreateTypeError(targetJavascriptLibrary);
    break;
  case kjstURIError:
    local_20 = JavascriptLibrary::CreateURIError(targetJavascriptLibrary);
    break;
  case kjstAggregateError:
    local_20 = JavascriptLibrary::CreateAggregateError(targetJavascriptLibrary);
    break;
  case kjstWebAssemblyCompileError:
    JavascriptLibrary::CreateWebAssemblyCompileError(targetJavascriptLibrary);
  case kjstWebAssemblyRuntimeError:
    JavascriptLibrary::CreateWebAssemblyRuntimeError(targetJavascriptLibrary);
  case kjstWebAssemblyLinkError:
    local_20 = JavascriptLibrary::CreateWebAssemblyLinkError(targetJavascriptLibrary);
  case kjstCustomError:
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0x377,"(false)","Unhandled error type?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return local_20;
}

Assistant:

JavascriptError* JavascriptError::CreateNewErrorOfSameType(JavascriptLibrary* targetJavascriptLibrary)
    {
        JavascriptError* jsNewError = nullptr;
        switch (this->GetErrorType())
        {
        case kjstError:
            jsNewError = targetJavascriptLibrary->CreateError();
            break;
        case kjstEvalError:
            jsNewError = targetJavascriptLibrary->CreateEvalError();
            break;
        case kjstRangeError:
            jsNewError = targetJavascriptLibrary->CreateRangeError();
            break;
        case kjstReferenceError:
            jsNewError = targetJavascriptLibrary->CreateReferenceError();
            break;
        case kjstSyntaxError:
            jsNewError = targetJavascriptLibrary->CreateSyntaxError();
            break;
        case kjstTypeError:
            jsNewError = targetJavascriptLibrary->CreateTypeError();
            break;
        case kjstURIError:
            jsNewError = targetJavascriptLibrary->CreateURIError();
            break;
        case kjstAggregateError:
            jsNewError = targetJavascriptLibrary->CreateAggregateError();
            break;
        case kjstWebAssemblyCompileError:
            jsNewError = targetJavascriptLibrary->CreateWebAssemblyCompileError();
        case kjstWebAssemblyRuntimeError:
            jsNewError = targetJavascriptLibrary->CreateWebAssemblyRuntimeError();
        case kjstWebAssemblyLinkError:
            jsNewError = targetJavascriptLibrary->CreateWebAssemblyLinkError();

        case kjstCustomError:
        default:
            AssertMsg(false, "Unhandled error type?");
            break;
        }
        return jsNewError;
    }